

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Abc_TtImplementNpnConfig(word *pTruth,int nVars,char *pCanonPerm,uint uCanonPhase)

{
  char cVar1;
  word wVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  word *pwVar6;
  uint uVar7;
  word *pLimit;
  int iVar8;
  ulong uVar9;
  word *pwVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (0 < (int)uVar3 && (uCanonPhase >> (nVars & 0x1fU) & 1) != 0) {
    uVar5 = 0;
    do {
      pTruth[uVar5] = ~pTruth[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if (0 < nVars) {
    uVar12 = (ulong)(uint)nVars;
    uVar5 = 0;
    do {
      if ((uCanonPhase >> ((uint)uVar5 & 0x1f) & 1) != 0) {
        bVar4 = (byte)(1 << ((byte)uVar5 & 0x1f));
        if (uVar3 == 1) {
          *pTruth = (s_Truths6[uVar5] & *pTruth) >> (bVar4 & 0x3f) |
                    *pTruth << (bVar4 & 0x3f) & s_Truths6[uVar5];
        }
        else if (uVar5 < 6) {
          if (0 < (int)uVar3) {
            uVar11 = s_Truths6[uVar5];
            uVar9 = 0;
            do {
              pTruth[uVar9] =
                   (pTruth[uVar9] & uVar11) >> (bVar4 & 0x3f) |
                   pTruth[uVar9] << (bVar4 & 0x3f) & uVar11;
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
        }
        else if (0 < (int)uVar3) {
          bVar4 = (byte)(uVar5 - 6);
          uVar7 = 1 << (bVar4 & 0x1f);
          iVar8 = 2 << (bVar4 & 0x1f);
          uVar11 = 1;
          if (1 < (int)uVar7) {
            uVar11 = (ulong)uVar7;
          }
          pwVar10 = pTruth + (int)uVar7;
          pwVar6 = pTruth;
          do {
            if (uVar5 - 6 != 0x1f) {
              uVar9 = 0;
              do {
                wVar2 = pwVar6[uVar9];
                pwVar6[uVar9] = pwVar10[uVar9];
                pwVar10[uVar9] = wVar2;
                uVar9 = uVar9 + 1;
              } while (uVar11 != uVar9);
            }
            pwVar6 = pwVar6 + iVar8;
            pwVar10 = pwVar10 + iVar8;
          } while (pwVar6 < pTruth + (int)uVar3);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar12);
    if (pCanonPerm != (char *)0x0 && 0 < nVars) {
      uVar11 = 0;
      uVar5 = uVar11;
      do {
        while (uVar5 != (uint)(int)pCanonPerm[uVar11]) {
          uVar11 = uVar11 + 1;
          if (uVar12 == uVar11) {
            __assert_fail("k < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x787,"void Abc_TtImplementNpnConfig(word *, int, char *, unsigned int)")
            ;
          }
        }
        if (uVar5 != (uVar11 & 0xffffffff)) {
          Abc_TtSwapVars(pTruth,nVars,(int)uVar5,(int)uVar11);
          cVar1 = pCanonPerm[uVar5];
          pCanonPerm[uVar5] = pCanonPerm[uVar11];
          pCanonPerm[uVar11] = cVar1;
        }
        uVar11 = uVar5 + 1;
        uVar5 = uVar11;
      } while (uVar11 != uVar12);
    }
  }
  return;
}

Assistant:

static inline void Abc_TtImplementNpnConfig( word * pTruth, int nVars, char * pCanonPerm, unsigned uCanonPhase )
{
    int i, k, nWords = Abc_TtWordNum( nVars );
    if ( (uCanonPhase >> nVars) & 1 )
        Abc_TtNot( pTruth, nWords );
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            Abc_TtFlip( pTruth, nWords, i );
    if ( pCanonPerm )
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = i; k < nVars; k++ )
            if ( pCanonPerm[k] == i )
                break;
        assert( k < nVars );
        if ( i == k )
            continue;
        Abc_TtSwapVars( pTruth, nVars, i, k );
        ABC_SWAP( int, pCanonPerm[i], pCanonPerm[k] );
    }
}